

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::substring::merge_forward<char*,bitmap::BitmapArray<long>::iterator,long*>
               (char *T,iterator PA,long *buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  int iVar1;
  undefined4 extraout_var;
  pos_type pVar2;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar3;
  ulong uVar4;
  BitmapArray<long> *pBVar5;
  long *plVar6;
  pos_type pVar7;
  pos_type pVar8;
  iterator p1;
  iterator p2;
  value_reference local_78;
  long *local_68;
  value_reference local_60;
  long local_50;
  char *local_48;
  BitmapArray<long> *local_40;
  pos_type local_38;
  
  pVar7 = first.pos_;
  pBVar5 = first.array_;
  local_38 = PA.pos_;
  local_40 = PA.array_;
  local_68 = buf + (middle.pos_ - pVar7);
  local_48 = T;
  helper::vecswap<bitmap::BitmapArray<long>::iterator,long*>(first,middle,buf);
  iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7);
  local_50 = CONCAT44(extraout_var,iVar1);
  do {
    while( true ) {
      pVar8 = local_38;
      pVar2 = *buf + local_38;
      iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
      p1.pos_ = pVar2;
      p1.array_ = local_40;
      p2.pos_ = CONCAT44(extraout_var_00,iVar1) + pVar8;
      p2.array_ = local_40;
      iVar1 = compare<char*,bitmap::BitmapArray<long>::iterator>(local_48,p1,p2,depth);
      if (iVar1 < 0) break;
      uVar4 = middle.pos_;
      pVar8 = pVar7;
      if (iVar1 == 0) {
        iVar1 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (middle.array_,middle.pos_,~CONCAT44(extraout_var_03,iVar1));
        lVar3 = *buf;
        plVar6 = buf;
        do {
          buf = plVar6 + 1;
          pVar8 = pVar7 + 1;
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar7,lVar3);
          iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar8);
          *plVar6 = CONCAT44(extraout_var_04,iVar1);
          if (local_68 <= buf) goto LAB_0010ce6b;
          lVar3 = *buf;
          pVar7 = pVar8;
          plVar6 = buf;
        } while (lVar3 < 0);
        do {
          local_60.array_ = middle.array_;
          pVar7 = pVar8 + 1;
          local_78.array_ = pBVar5;
          local_78.pos_ = pVar8;
          local_60.pos_ = uVar4;
          bitmap::BitmapArray<long>::value_reference::operator=(&local_78,&local_60);
          local_78.array_ = middle.array_;
          middle.pos_ = uVar4 + 1;
          local_78.pos_ = uVar4;
          local_60.array_ = pBVar5;
          local_60.pos_ = pVar7;
          bitmap::BitmapArray<long>::value_reference::operator=(&local_78,&local_60);
          if (last.pos_ <= middle.pos_) goto LAB_0010ce36;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
          uVar4 = middle.pos_;
          pVar8 = pVar7;
        } while (extraout_var_05 < 0);
      }
      else {
        do {
          local_60.array_ = middle.array_;
          pVar7 = pVar8 + 1;
          local_78.array_ = pBVar5;
          local_78.pos_ = pVar8;
          local_60.pos_ = uVar4;
          bitmap::BitmapArray<long>::value_reference::operator=(&local_78,&local_60);
          local_78.array_ = middle.array_;
          middle.pos_ = uVar4 + 1;
          local_78.pos_ = uVar4;
          local_60.array_ = pBVar5;
          local_60.pos_ = pVar7;
          bitmap::BitmapArray<long>::value_reference::operator=(&local_78,&local_60);
          if (last.pos_ <= middle.pos_) goto LAB_0010cdf6;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
          uVar4 = middle.pos_;
          pVar8 = pVar7;
        } while (extraout_var_01 < 0);
      }
    }
    lVar3 = *buf;
    pVar8 = pVar7;
    plVar6 = buf;
    do {
      buf = plVar6 + 1;
      pVar7 = pVar8 + 1;
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar8,lVar3);
      iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7);
      *plVar6 = CONCAT44(extraout_var_02,iVar1);
      if (local_68 <= buf) goto LAB_0010ce6b;
      lVar3 = *buf;
      pVar8 = pVar7;
      plVar6 = buf;
    } while (lVar3 < 0);
  } while( true );
LAB_0010cdf6:
  do {
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar7,*buf);
    iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7 + 1);
    *buf = CONCAT44(extraout_var_06,iVar1);
    buf = buf + 1;
    pVar7 = pVar7 + 1;
  } while (buf < local_68);
  goto LAB_0010ce6b;
LAB_0010ce36:
  do {
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar7,*buf);
    iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7 + 1);
    *buf = CONCAT44(extraout_var_07,iVar1);
    buf = buf + 1;
    pVar7 = pVar7 + 1;
  } while (buf < local_68);
LAB_0010ce6b:
  local_68[-1] = local_50;
  return;
}

Assistant:

void merge_forward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  bufend = buf + (middle - first);
  helper::vecswap(first, middle, buf);

  for (t = *first, i = first, j = buf, k = middle;;) {
    r = compare(T, PA + *j, PA + *k, depth);
    if (r < 0) {
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);
    } else if (r > 0) {
      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    } else {
      *k = ~*k;
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);

      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    }
  }
}